

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

int ReadColorMap(gdIOCtx *fd,int number,uchar (*buffer) [256])

{
  int iVar1;
  ulong uVar2;
  uchar rgb [3];
  uchar local_2b;
  uchar local_2a;
  uchar local_29;
  
  if (number < 1) {
    return 0;
  }
  uVar2 = 0;
  do {
    iVar1 = gdGetBuf(&local_2b,3,fd);
    if (iVar1 < 1) {
      return 1;
    }
    (*buffer)[uVar2] = local_2b;
    buffer[1][uVar2] = local_2a;
    buffer[2][uVar2] = local_29;
    uVar2 = uVar2 + 1;
  } while ((uint)number != uVar2);
  return 0;
}

Assistant:

static int
ReadColorMap(gdIOCtx *fd, int number, unsigned char (*buffer)[256])
{
	int i;
	unsigned char rgb[3];

	for(i = 0; i < number; ++i) {
		if(!ReadOK(fd, rgb, sizeof(rgb))) {
			return TRUE;
		}

		buffer[CM_RED][i] = rgb[0];
		buffer[CM_GREEN][i] = rgb[1];
		buffer[CM_BLUE][i] = rgb[2];
	}

	return FALSE;
}